

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall gulcalc::covoutputgul(gulcalc *this,gulcoverageSampleslevel *gg)

{
  uchar *puVar1;
  gulSampleslevelRec r;
  gulSampleslevelRec r_1;
  gulcoverageSampleslevel *gg_local;
  gulcalc *this_local;
  
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    if (15999 < this->covbufoffset_) {
      (*this->coverageWriter_)(this->cbuf_,1,this->covbufoffset_);
      this->covbufoffset_ = 0;
    }
    if ((gg->event_id != lastcoverageheader.event_id) ||
       (gg->coverage_id != lastcoverageheader.item_id)) {
      if ((this->isFirstCovEvent_ & 1U) == 0) {
        puVar1 = this->cbuf_ + this->covbufoffset_;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        this->covbufoffset_ = this->covbufoffset_ + 8;
      }
      else {
        this->isFirstCovEvent_ = false;
      }
      lastcoverageheader.event_id = gg->event_id;
      lastcoverageheader.item_id = gg->coverage_id;
      *(undefined8 *)(this->cbuf_ + this->covbufoffset_) = *(undefined8 *)gg;
      this->covbufoffset_ = this->covbufoffset_ + 8;
    }
    *(undefined8 *)(this->cbuf_ + this->covbufoffset_) = *(undefined8 *)&gg->sidx;
    this->covbufoffset_ = this->covbufoffset_ + 8;
  }
  return;
}

Assistant:

void gulcalc::covoutputgul(gulcoverageSampleslevel &gg)
{
	if (coverageWriter_ == 0)  return;
	if (covbufoffset_ >= bufsize) {
		coverageWriter_(cbuf_,sizeof(unsigned char), covbufoffset_);
		covbufoffset_ = 0;
	}

	if (gg.event_id != lastcoverageheader.event_id || gg.coverage_id != lastcoverageheader.item_id) {
		if (isFirstCovEvent_ == false) {
			gulSampleslevelRec r;
			r.sidx = 0;
			r.loss = 0;
			memcpy(cbuf_ + covbufoffset_, &r, sizeof(gulSampleslevelRec));
			covbufoffset_ += sizeof(gulSampleslevelRec);	// null terminate list
		}
		else {
			isFirstCovEvent_ = false;
		}
		lastcoverageheader.event_id = gg.event_id;
		lastcoverageheader.item_id = gg.coverage_id;
		memcpy(cbuf_ + covbufoffset_, &lastcoverageheader, sizeof(lastcoverageheader));
		covbufoffset_ += sizeof(lastcoverageheader);
	}

	gulSampleslevelRec r;
	r.sidx = gg.sidx;
	r.loss = gg.loss;
	memcpy(cbuf_ + covbufoffset_, &r, sizeof(gulSampleslevelRec));
	covbufoffset_ += sizeof(gulSampleslevelRec);

}